

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

ArenaAllocator * __thiscall Js::ScriptContext::AllocatorForDiagnostics(ScriptContext *this)

{
  HeapAllocator *alloc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  this_00 = &this->diagnosticArena->
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  if (this_00 == (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0) {
    local_48 = (undefined1  [8])&Memory::ArenaAllocator::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d7f97f;
    data.filename._0_4_ = 0x5d6;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
    this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
              new<Memory::HeapAllocator>(0x80,alloc,0x2ff150);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
              (this_00,L"Diagnostic",&this->threadContext->debugManager->diagnosticPageAllocator,
               Throw::OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
    this->diagnosticArena = (ArenaAllocator *)this_00;
  }
  return (ArenaAllocator *)this_00;
}

Assistant:

ArenaAllocator* ScriptContext::AllocatorForDiagnostics()
    {
        if (this->diagnosticArena == nullptr)
        {
            this->diagnosticArena = HeapNew(ArenaAllocator, _u("Diagnostic"), this->GetThreadContext()->GetDebugManager()->GetDiagnosticPageAllocator(), Throw::OutOfMemory);
        }
        Assert(this->diagnosticArena != nullptr);
        return this->diagnosticArena;
    }